

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bit_vector.h
# Opt level: O2

dynamic_bit_vector * bsim::andr(dynamic_bit_vector *__return_storage_ptr__,dynamic_bit_vector *a)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  allocator local_29;
  string local_28;
  
  uVar4 = 0;
  uVar2 = (ulong)(uint)a->N;
  if (a->N < 1) {
    uVar2 = uVar4;
  }
  do {
    uVar3 = (uint)uVar4;
    if ((uint)uVar2 == uVar3) {
      std::__cxx11::string::string((string *)&local_28,"1",&local_29);
      dynamic_bit_vector::dynamic_bit_vector(__return_storage_ptr__,1,&local_28);
      goto LAB_001706ca;
    }
    uVar1 = uVar4 >> 3;
    uVar4 = (ulong)(uVar3 + 1);
  } while (((a->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar1] >> (uVar3 & 7) & 1) != 0);
  std::__cxx11::string::string((string *)&local_28,"0",&local_29);
  dynamic_bit_vector::dynamic_bit_vector(__return_storage_ptr__,1,&local_28);
LAB_001706ca:
  std::__cxx11::string::~string((string *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

static inline dynamic_bit_vector
  andr(const dynamic_bit_vector& a) {
    for (int i = 0; i < a.bitLength(); i++) {
      if (a.get(i) != 1) {
	return dynamic_bit_vector(1, "0");
      }
    }

    return dynamic_bit_vector(1, "1");
  }